

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::setFragment(XMLUri *this,XMLCh *newFragment)

{
  bool bVar1;
  XMLCh *pXVar2;
  MalformedURLException *this_00;
  
  if (newFragment == (XMLCh *)0x0) {
    if (this->fFragment != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    this->fFragment = (XMLCh *)0x0;
    return;
  }
  if (this->fHost == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x51e,XMLNUM_URI_Component_for_GenURI_Only,(XMLCh *)errMsg_FRAGMENT,newFragment,
               (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
  }
  else if (this->fPath == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x526,XMLNUM_URI_NullPath,(XMLCh *)errMsg_FRAGMENT,newFragment,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
  }
  else {
    bVar1 = isURIString(newFragment);
    if (bVar1) {
      if (this->fFragment != (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
      }
      pXVar2 = XMLString::replicate(newFragment,this->fMemoryManager);
      this->fFragment = pXVar2;
      return;
    }
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x52d,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_FRAGMENT,(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
  }
  __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLUri::setFragment(const XMLCh* const newFragment)
{
	if ( !newFragment )
    {
        if (getFragment())
            fMemoryManager->deallocate(fFragment);//delete [] fFragment;

        fFragment = 0;
	}
	else if (!isGenericURI())
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_for_GenURI_Only
                , errMsg_FRAGMENT
                , newFragment
                , fMemoryManager);
	}
	else if ( !getPath() )
    {
        ThrowXMLwithMemMgr2(MalformedURLException
               , XMLExcepts::XMLNUM_URI_NullPath
               , errMsg_FRAGMENT
               , newFragment
               , fMemoryManager);
	}
	else if (!isURIString(newFragment))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                , errMsg_FRAGMENT
                , fMemoryManager);
	}
	else
    {
        if (getFragment())
        {
            fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        }

        fFragment = XMLString::replicate(newFragment, fMemoryManager);
	}
}